

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

AActor * P_SpawnPlayerMissile
                   (AActor *source,double x,double y,double z,PClassActor *type,DAngle *angle,
                   FTranslatedLineTarget *pLineTarget,AActor **pMissileActor,bool nofreeaim,
                   bool noautoaim,int aimflags)

{
  AActor *this;
  bool bVar1;
  uint uVar2;
  ActorFlags3 *other;
  double dVar3;
  double local_128;
  double local_100;
  TFlags<ActorFlag4,_unsigned_int> local_f4;
  TAngle<double> local_f0;
  undefined1 local_e8 [4];
  TFlags<ActorFlag3,_unsigned_int> local_e4;
  AActor *local_e0;
  AActor *MissileActor;
  DVector3 pos;
  undefined1 local_b8 [16];
  TAngle<double> local_a8;
  int local_9c;
  double dStack_98;
  int i;
  double linetargetrange;
  DAngle vrange;
  AActor *defaultobject;
  FTranslatedLineTarget scratch;
  DAngle pitch;
  DAngle an;
  bool noautoaim_local;
  bool nofreeaim_local;
  AActor **pMissileActor_local;
  FTranslatedLineTarget *pLineTarget_local;
  DAngle *angle_local;
  PClassActor *type_local;
  double z_local;
  double y_local;
  double x_local;
  AActor *source_local;
  
  TAngle<double>::TAngle(&pitch,angle);
  TAngle<double>::TAngle((TAngle<double> *)&scratch.unlinked);
  FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)&defaultobject);
  vrange.Degrees = (double)GetDefaultByType(&type->super_PClass);
  local_100 = 35.0;
  if (!nofreeaim) {
    local_100 = 0.0;
  }
  TAngle<double>::TAngle((TAngle<double> *)&linetargetrange,local_100);
  if (source == (AActor *)0x0) {
    source_local = (AActor *)0x0;
  }
  else {
    pMissileActor_local = &pLineTarget->linetarget;
    if (pLineTarget == (FTranslatedLineTarget *)0x0) {
      pMissileActor_local = &defaultobject;
    }
    if (((source->player == (player_t *)0x0) || (source->player->ReadyWeapon == (AWeapon *)0x0)) ||
       (((*(uint *)&(source->player->ReadyWeapon->super_AInventory).field_0x4dc & 0x4000) == 0 &&
        (!noautoaim)))) {
      if (*(double *)((long)vrange.Degrees + 0x2c0) <= 0.0) {
        local_128 = 1024.0;
      }
      else {
        local_128 = *(double *)((long)vrange.Degrees + 0x2c0) * 64.0;
      }
      dStack_98 = local_128;
      local_9c = 2;
      do {
        TAngle<double>::operator+(&local_a8,P_SpawnPlayerMissile::angdiff[local_9c]);
        TAngle<double>::operator=(&pitch,&local_a8);
        TAngle<double>::TAngle((TAngle<double> *)local_b8,&pitch);
        dVar3 = dStack_98;
        TAngle<double>::TAngle((TAngle<double> *)&pos.Z,(TAngle<double> *)&linetargetrange);
        P_AimLineAttack((AActor *)(local_b8 + 8),(DAngle *)source,dVar3,
                        (FTranslatedLineTarget *)local_b8,(DAngle *)pMissileActor_local,
                        (int)&pos + 0x10,(AActor *)(ulong)(uint)aimflags,(AActor *)0x0);
        TAngle<double>::operator=
                  ((TAngle<double> *)&scratch.unlinked,(TAngle<double> *)(local_b8 + 8));
        if ((((source->player != (player_t *)0x0) && (!nofreeaim)) &&
            (bVar1 = FLevelLocals::IsFreelookAllowed(&level), bVar1)) &&
           (dVar3 = userinfo_t::GetAimDist(&source->player->userinfo), dVar3 <= 0.5)) break;
        bVar1 = false;
        if (*pMissileActor_local == (AActor *)0x0) {
          local_9c = local_9c + -1;
          bVar1 = -1 < local_9c;
        }
      } while (bVar1);
      if ((*pMissileActor_local == (AActor *)0x0) &&
         ((TAngle<double>::operator=(&pitch,angle), nofreeaim ||
          (bVar1 = FLevelLocals::IsFreelookAllowed(&level), !bVar1)))) {
        TAngle<double>::operator=((TAngle<double> *)&scratch.unlinked,0.0);
      }
    }
    else {
      TAngle<double>::operator=(&pitch,angle);
      TAngle<double>::operator=((TAngle<double> *)&scratch.unlinked,&(source->Angles).Pitch);
      *pMissileActor_local = (AActor *)0x0;
    }
    type_local = (PClassActor *)z;
    if (((z != -2147483648.0) || (NAN(z))) && ((z != 2147483647.0 || (NAN(z))))) {
      dVar3 = AActor::Center(source);
      dVar3 = (dVar3 - source->Floorclip) + z;
      if (source->player == (player_t *)0x0) {
        type_local = (PClassActor *)(dVar3 + 4.0);
      }
      else {
        type_local = (PClassActor *)
                     ((source->player->mo->AttackZOffset - 4.0) * source->player->crouchfactor +
                     dVar3);
      }
      if ((double)type_local < source->floorz) {
        type_local = (PClassActor *)source->floorz;
      }
    }
    AActor::Vec2OffsetZ((DVector3 *)&MissileActor,source,x,y,(double)type_local,false);
    local_e0 = Spawn(type,(DVector3 *)&MissileActor,ALLOW_REPLACE);
    if (pMissileActor != (AActor **)0x0) {
      *pMissileActor = local_e0;
    }
    P_PlaySpawnSound(local_e0,source);
    TObjPtr<AActor>::operator=(&local_e0->target,source);
    TAngle<double>::operator=(&(local_e0->Angles).Yaw,&pitch);
    other = &local_e0->flags3;
    operator|((EnumType)local_e8,MF3_FLOORHUGGER);
    TFlags<ActorFlag3,_unsigned_int>::operator&(&local_e4,other);
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e4);
    this = local_e0;
    if (uVar2 == 0) {
      TAngle<double>::TAngle(&local_f0,(TAngle<double> *)&scratch.unlinked);
      AActor::Vel3DFromAngle(this,&local_f0,local_e0->Speed);
    }
    else {
      AActor::VelFromAngle(local_e0);
    }
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_f4,
               (int)local_e0 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f4);
    if (uVar2 != 0) {
      AActor::SetFriendPlayer(local_e0,source->player);
    }
    bVar1 = P_CheckMissileSpawn(local_e0,source->radius);
    if (bVar1) {
      source_local = local_e0;
    }
    else {
      source_local = (AActor *)0x0;
    }
  }
  return source_local;
}

Assistant:

AActor *P_SpawnPlayerMissile (AActor *source, double x, double y, double z,
							  PClassActor *type, DAngle angle, FTranslatedLineTarget *pLineTarget, AActor **pMissileActor,
							  bool nofreeaim, bool noautoaim, int aimflags)
{
	static const double angdiff[3] = { -5.625, 5.625, 0 };
	DAngle an = angle;
	DAngle pitch;
	FTranslatedLineTarget scratch;
	AActor *defaultobject = GetDefaultByType(type);
	DAngle vrange = nofreeaim ? 35. : 0.;

	if (source == NULL)
	{
		return NULL;
	}
	if (!pLineTarget) pLineTarget = &scratch;
	if (source->player && source->player->ReadyWeapon && ((source->player->ReadyWeapon->WeaponFlags & WIF_NOAUTOAIM) || noautoaim))
	{
		// Keep exactly the same angle and pitch as the player's own aim
		an = angle;
		pitch = source->Angles.Pitch;
		pLineTarget->linetarget = NULL;
	}
	else // see which target is to be aimed at
	{
		// [XA] If MaxTargetRange is defined in the spawned projectile, use this as the
		//      maximum range for the P_AimLineAttack call later; this allows MaxTargetRange
		//      to function as a "maximum tracer-acquisition range" for seeker missiles.
		double linetargetrange = defaultobject->maxtargetrange > 0 ? defaultobject->maxtargetrange*64 : 16*64.;

		int i = 2;
		do
		{
			an = angle + angdiff[i];
			pitch = P_AimLineAttack (source, an, linetargetrange, pLineTarget, vrange, aimflags);
	
			if (source->player != NULL &&
				!nofreeaim &&
				level.IsFreelookAllowed() &&
				source->player->userinfo.GetAimDist() <= 0.5)
			{
				break;
			}
		} while (pLineTarget->linetarget == NULL && --i >= 0);

		if (pLineTarget->linetarget == NULL)
		{
			an = angle;
			if (nofreeaim || !level.IsFreelookAllowed())
			{
				pitch = 0.;
			}
		}
	}

	if (z != ONFLOORZ && z != ONCEILINGZ)
	{
		// Doom spawns missiles 4 units lower than hitscan attacks for players.
		z += source->Center() - source->Floorclip;
		if (source->player != NULL)	// Considering this is for player missiles, it better not be NULL.
		{
			z += ((source->player->mo->AttackZOffset - 4) * source->player->crouchfactor);
		}
		else
		{
			z += 4;
		}
		// Do not fire beneath the floor.
		if (z < source->floorz)
		{
			z = source->floorz;
		}
	}
	DVector3 pos = source->Vec2OffsetZ(x, y, z);
	AActor *MissileActor = Spawn (type, pos, ALLOW_REPLACE);
	if (pMissileActor) *pMissileActor = MissileActor;
	P_PlaySpawnSound(MissileActor, source);
	MissileActor->target = source;
	MissileActor->Angles.Yaw = an;
	if (MissileActor->flags3 & (MF3_FLOORHUGGER | MF3_CEILINGHUGGER))
	{
		MissileActor->VelFromAngle();
	}
	else
	{
		MissileActor->Vel3DFromAngle(pitch, MissileActor->Speed);
	}

	if (MissileActor->flags4 & MF4_SPECTRAL)
	{
		MissileActor->SetFriendPlayer(source->player);
	}
	if (P_CheckMissileSpawn (MissileActor, source->radius))
	{
		return MissileActor;
	}
	return NULL;
}